

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O1

cio_error cio_uart_get_num_data_bits(cio_uart *port,cio_uart_num_data_bits *num_data_bits)

{
  cio_error cVar1;
  termios tty;
  
  if (port != (cio_uart *)0x0) {
    cVar1 = get_current_settings(port,&tty);
    if (cVar1 == CIO_SUCCESS) {
      *num_data_bits = tty.c_cflag >> 4 & CIO_UART_8_DATA_BITS;
      cVar1 = CIO_SUCCESS;
    }
    return cVar1;
  }
  return CIO_INVALID_ARGUMENT;
}

Assistant:

enum cio_error cio_uart_get_num_data_bits(const struct cio_uart *port, enum cio_uart_num_data_bits *num_data_bits)
{
	if (cio_unlikely(port == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	struct termios tty;
	enum cio_error err = get_current_settings(port, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	switch (tty.c_cflag & (tcflag_t)CSIZE) {
	case CS5:
		*num_data_bits = CIO_UART_5_DATA_BITS;
		break;
	case CS6:
		*num_data_bits = CIO_UART_6_DATA_BITS;
		break;
	case CS7:
		*num_data_bits = CIO_UART_7_DATA_BITS;
		break;
	case CS8:
	default:
		*num_data_bits = CIO_UART_8_DATA_BITS;
		break;
	}

	return CIO_SUCCESS;
}